

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O0

int Abc_NtkCountFaninsTotal(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pNode;
  int local_2c;
  int local_28;
  int Counter;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_2c = 0;
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pObj_00 = Abc_NtkObj(pNtk,Counter);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        pNode = Abc_ObjFanin(pObj_00,local_28);
        iVar1 = Abc_ObjIsNode(pObj_00);
        if ((((iVar1 != 0) || (iVar1 = Abc_ObjIsPo(pObj_00), iVar1 != 0)) &&
            ((iVar1 = Abc_ObjIsPo(pObj_00), iVar1 == 0 || (iVar1 = Abc_NtkPoNum(pNtk), iVar1 != 1)))
            ) && ((iVar1 = Abc_ObjIsNode(pObj_00), iVar1 == 0 ||
                  (iVar1 = Abc_NodeIsConst(pNode), iVar1 == 0)))) {
          local_2c = local_2c + 1;
        }
      }
    }
  }
  return local_2c;
}

Assistant:

int Abc_NtkCountFaninsTotal( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsPo(pObj) )
                continue;
            if ( Abc_ObjIsPo(pObj) && Abc_NtkPoNum(pNtk) == 1 )
                continue;
            if ( Abc_ObjIsNode(pObj) && Abc_NodeIsConst(pFanin) )
                continue;
            Counter++;
        }
    return Counter;
}